

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copy.cpp
# Opt level: O1

void __thiscall ObserverManager_Copy1_Test::TestBody(ObserverManager_Copy1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  A a2;
  A a1;
  stringstream out;
  AssertHelper local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  internal local_228 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  undefined1 local_218 [24];
  string local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  size_type local_1c0;
  char local_1b8 [16];
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_218._0_8_ = local_218 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"A","");
  A::A((A *)local_1e0,local_198,(string *)local_218);
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_);
  }
  ObserverManager::subscribe<FooBarProtocol,A>((A *)local_1e0);
  local_218._16_8_ = local_1e0._16_8_;
  BaseObserverProtocol::BaseObserverProtocol
            ((BaseObserverProtocol *)local_218,(BaseObserverProtocol *)local_1e0);
  local_218._0_8_ = &PTR__A_0015dd00;
  local_200._0_8_ = local_1f0;
  std::__cxx11::string::_M_construct<char*>
            (local_200,local_1e0._24_8_,(char *)(local_1c0 + local_1e0._24_8_));
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            (local_228,"\"A \"","out.str()",(char (*) [3])0x14b7bb,&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if (local_228[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_220.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((long *)local_248._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_248._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_248._M_dataplus._M_p + 8))();
      }
      local_248._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ObserverManager::subscribe<FooBarProtocol,A>((A *)local_218);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            (local_228,"\"A A A \"","out.str()",(char (*) [7])"A A A ",&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if (local_228[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_248);
    if (local_220.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_220.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,(Message *)&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    if ((long *)local_248._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_248._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_248._M_dataplus._M_p + 8))();
      }
      local_248._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_220,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_218._0_8_ = &PTR__A_0015dd00;
  if ((undefined1 *)local_200._0_8_ != local_1f0) {
    operator_delete((void *)local_200._0_8_);
  }
  BaseObserverProtocol::~BaseObserverProtocol((BaseObserverProtocol *)local_218);
  local_1e0._0_8_ = &PTR__A_0015dd00;
  if ((char *)local_1e0._24_8_ != local_1b8) {
    operator_delete((void *)local_1e0._24_8_);
  }
  BaseObserverProtocol::~BaseObserverProtocol((BaseObserverProtocol *)local_1e0);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)local_218,"\"A A A \"","out.str()",(char (*) [7])"A A A ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
  if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if (local_218[0] == (string)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if ((undefined8 *)local_218._8_8_ == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_218._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Copy.cpp"
               ,0x28,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if ((_func_int **)local_1e0._0_8_ != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((_func_int **)local_1e0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ = (_func_int **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_218 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

TEST(ObserverManager, Copy1) {
    std::stringstream out;

    {
        A a1(out, "A");
        ObserverManager::subscribe<FooBarProtocol>(&a1);

        A a2(a1);

        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A ", out.str());

        ObserverManager::subscribe<FooBarProtocol>(&a2);

        ObserverManager::notify(&FooBarProtocol::foo);
        EXPECT_EQ("A A A ", out.str());
    }

    ObserverManager::notify(&FooBarProtocol::foo);
    EXPECT_EQ("A A A ", out.str());
}